

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

void gimage::anon_unknown_17::loadTiledHeader
               (BasicImageIO *io,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *list,string *prefix,string *suffix,long *twidth,long *theight,long *tborder,
               long *width,long *height,int *depth)

{
  _func_int ***ppp_Var1;
  BasicImageIO *pBVar2;
  istream *piVar3;
  _Base_ptr p_Var4;
  IOException *pIVar5;
  uint uVar6;
  uint uVar7;
  char sep3;
  char sep2;
  char sep1;
  string *local_248;
  string *local_240;
  BasicImageIO *local_238;
  int k;
  long *local_228;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  Properties prop;
  istringstream in;
  int aiStack_190 [88];
  
  local_240 = suffix;
  local_238 = io;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&list->_M_t);
  *twidth = 0;
  *theight = 0;
  *tborder = 0;
  *width = 0;
  *height = 0;
  *depth = 0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_248 = prefix;
  local_228 = twidth;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,prefix,
                 ".hdr");
  gutil::Properties::load(&prop,_in);
  std::__cxx11::string::~string((string *)&in);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,local_248,
                 "_param.txt");
  gutil::Properties::load(&prop,_in);
  std::__cxx11::string::~string((string *)&in);
  gutil::Properties::getValue<long>(&prop,"border",tborder,"0");
  gutil::getFileList(list,local_248,local_240);
  pBVar2 = local_238;
  if ((list->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                   "There are no tiles: ",local_248);
    std::operator+(&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,':');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   &local_200,local_240);
    gutil::IOException::IOException(pIVar5,(string *)&in);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  ppp_Var1 = &local_238->_vptr_BasicImageIO;
  local_238 = (BasicImageIO *)theight;
  (*(*ppp_Var1)[4])(pBVar2,*(undefined8 *)
                            ((list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1),
                    local_228,theight,depth);
  uVar6 = 0;
  uVar7 = 0;
  for (p_Var4 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(list->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::__cxx11::string::substr((ulong)&local_200,(ulong)(p_Var4 + 1));
    std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)&local_200,_S_in);
    std::__cxx11::string::~string((string *)&local_200);
    piVar3 = std::operator>>((istream *)&in,&sep1);
    piVar3 = (istream *)std::istream::operator>>((istream *)piVar3,&k);
    piVar3 = std::operator>>(piVar3,&sep2);
    piVar3 = (istream *)std::istream::operator>>((istream *)piVar3,&i);
    std::operator>>(piVar3,&sep3);
    if ((((*(int *)((long)aiStack_190 + *(long *)(_in + -0x18)) == 0) && (sep1 == '_')) &&
        (sep2 == '_')) && (sep3 == '_')) {
      if ((int)uVar6 <= (int)(i + 1U)) {
        uVar6 = i + 1U;
      }
      if ((int)uVar7 <= (int)(k + 1U)) {
        uVar7 = k + 1U;
      }
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
  }
  if ((uVar6 != 0) && (uVar7 != 0)) {
    *width = (ulong)uVar6 * (*local_228 + *tborder * -2);
    *height = (ulong)uVar7 * (*(long *)local_238 + *tborder * -2);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&prop);
    return;
  }
  pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 "This is not a tiled image: ",local_248);
  std::operator+(&local_200,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 ':');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,&local_200
                 ,local_240);
  gutil::IOException::IOException(pIVar5,(string *)&in);
  __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void loadTiledHeader(const BasicImageIO &io, std::set<std::string> &list,
                     const std::string &prefix, const std::string &suffix, long &twidth, long &theight,
                     long &tborder, long &width, long &height, int &depth)
{
  // initialise return parameters

  list.clear();
  twidth=0;
  theight=0;
  tborder=0;
  width=0;
  height=0;
  depth=0;

  // get optional border size

  gutil::Properties prop;

  try
  {
    prop.load((prefix+".hdr").c_str());
  }
  catch (const std::exception &)
  { }

  try
  {
    prop.load((prefix+"_param.txt").c_str());
  }
  catch (const std::exception &)
  { }

  prop.getValue("border", tborder, "0");

  // get list of all tiles

  gutil::getFileList(list, prefix, suffix);

  if (list.empty())
  {
    throw gutil::IOException("There are no tiles: "+prefix+':'+suffix);
  }

  // load header information of first tile

  io.loadHeader((*list.begin()).c_str(), twidth, theight, depth);

  // determine number of rows and columns

  int rows=0;
  int cols=0;

  for (std::set<std::string>::iterator it=list.begin(); it!=list.end(); ++it)
  {
    int i, k;
    char sep1, sep2, sep3;
    std::istringstream in(it->substr(prefix.size(), it->size()-prefix.size()-suffix.size()));

    in >> sep1 >> k >> sep2 >> i >> sep3;

    if (in.good() && sep1 == '_' && sep2 == '_' && sep3 == '_')
    {
      cols=std::max(cols, i+1);
      rows=std::max(rows, k+1);
    }
  }

  if (cols == 0 || rows == 0)
  {
    throw gutil::IOException("This is not a tiled image: "+prefix+':'+suffix);
  }

  // compute total size

  width=(twidth-2*tborder)*cols;
  height=(theight-2*tborder)*rows;
}